

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O0

int BN_mod_exp2_mont(BIGNUM *r,BIGNUM *a1,BIGNUM *p1,BIGNUM *a2,BIGNUM *p2,BIGNUM *m,BN_CTX *ctx,
                    BN_MONT_CTX *m_ctx)

{
  bool bVar1;
  int iVar2;
  BN_MONT_CTX *__p;
  BIGNUM *pBVar3;
  pointer rr;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_58;
  UniquePtr<BIGNUM> tmp;
  unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> local_48;
  UniquePtr<BN_MONT_CTX> new_mont;
  BIGNUM *m_local;
  BIGNUM *p2_local;
  BIGNUM *a2_local;
  BIGNUM *p1_local;
  BIGNUM *a1_local;
  BIGNUM *rr_local;
  
  new_mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)m;
  std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)&local_48);
  if (m_ctx == (BN_MONT_CTX *)0x0) {
    __p = BN_MONT_CTX_new_for_modulus
                    ((BIGNUM *)
                     new_mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl,(BN_CTX *)ctx);
    std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::reset(&local_48,__p);
    bVar1 = std::operator==(&local_48,(nullptr_t)0x0);
    if (bVar1) {
      rr_local._4_4_ = 0;
      tmp._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
      goto LAB_00225ccd;
    }
    m_ctx = (BN_MONT_CTX *)std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::get(&local_48);
  }
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_58,(pointer)pBVar3);
  bVar1 = std::operator==(&local_58,(nullptr_t)0x0);
  if (bVar1) {
LAB_00225ca6:
    rr_local._4_4_ = 0;
  }
  else {
    iVar2 = BN_mod_exp_mont((BIGNUM *)r,(BIGNUM *)a1,(BIGNUM *)p1,
                            (BIGNUM *)
                            new_mont._M_t.
                            super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl,
                            (BN_CTX *)ctx,(BN_MONT_CTX *)m_ctx);
    if (iVar2 == 0) goto LAB_00225ca6;
    rr = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_58);
    iVar2 = BN_mod_exp_mont(rr,(BIGNUM *)a2,(BIGNUM *)p2,
                            (BIGNUM *)
                            new_mont._M_t.
                            super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl,
                            (BN_CTX *)ctx,(BN_MONT_CTX *)m_ctx);
    if (iVar2 == 0) goto LAB_00225ca6;
    iVar2 = BN_to_montgomery((BIGNUM *)r,(BIGNUM *)r,(BN_MONT_CTX *)m_ctx,(BN_CTX *)ctx);
    if (iVar2 == 0) goto LAB_00225ca6;
    pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_58);
    iVar2 = BN_mod_mul_montgomery(r,r,pBVar3,m_ctx,ctx);
    if (iVar2 == 0) goto LAB_00225ca6;
    rr_local._4_4_ = 1;
  }
  tmp._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ = 1;
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
LAB_00225ccd:
  std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
  return rr_local._4_4_;
}

Assistant:

int BN_mod_exp2_mont(BIGNUM *rr, const BIGNUM *a1, const BIGNUM *p1,
                     const BIGNUM *a2, const BIGNUM *p2, const BIGNUM *m,
                     BN_CTX *ctx, const BN_MONT_CTX *mont) {
  // Allocate a montgomery context if it was not supplied by the caller.
  bssl::UniquePtr<BN_MONT_CTX> new_mont;
  if (mont == nullptr) {
    new_mont.reset(BN_MONT_CTX_new_for_modulus(m, ctx));
    if (new_mont == nullptr) {
      return 0;
    }
    mont = new_mont.get();
  }

  // BN_mod_mul_montgomery removes one Montgomery factor, so passing one
  // Montgomery-encoded and one non-Montgomery-encoded value gives a
  // non-Montgomery-encoded result.
  bssl::UniquePtr<BIGNUM> tmp(BN_new());
  if (tmp == nullptr ||  //
      !BN_mod_exp_mont(rr, a1, p1, m, ctx, mont) ||
      !BN_mod_exp_mont(tmp.get(), a2, p2, m, ctx, mont) ||
      !BN_to_montgomery(rr, rr, mont, ctx) ||
      !BN_mod_mul_montgomery(rr, rr, tmp.get(), mont, ctx)) {
    return 0;
  }

  return 1;
}